

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O2

bool tcu::isLinearRangeValid(LookupPrecision *prec,Vec4 *c0,Vec4 *c1,Vec2 *fBounds,Vec4 *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  int compNdx;
  ulong uVar5;
  Vec4 rMin;
  Vec4 rMax;
  Vec4 i1;
  Vec4 i0;
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  
  operator*(local_50,1.0 - fBounds->m_data[0],c0);
  operator*(local_70,fBounds->m_data[0],c1);
  operator+(local_40,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_70);
  operator*(local_70,1.0 - fBounds->m_data[1],c0);
  operator*(local_60,fBounds->m_data[1],c1);
  operator+(local_50,(Vector<float,_4> *)local_70,(Vector<float,_4> *)local_60);
  operator-(local_70,result,&prec->colorThreshold);
  operator+(local_60,result,&prec->colorThreshold);
  for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
    if ((prec->colorMask).m_data[uVar5] == true) {
      fVar1 = *(float *)(local_40 + uVar5 * 4);
      fVar2 = *(float *)(local_70 + uVar5 * 4);
      fVar3 = *(float *)(local_50 + uVar5 * 4);
      if (fVar1 < fVar2 != fVar2 <= fVar3) {
        fVar4 = *(float *)(local_60 + uVar5 * 4);
        if ((fVar4 < fVar3 == fVar4 < fVar1) && (fVar2 <= fVar3 == fVar4 < fVar1)) break;
      }
    }
  }
  return 3 < uVar5;
}

Assistant:

static bool isLinearRangeValid (const LookupPrecision&	prec,
								const Vec4&				c0,
								const Vec4&				c1,
								const Vec2&				fBounds,
								const Vec4&				result)
{
	// This is basically line segment - AABB test. Valid interpolation line is checked
	// against result AABB constructed by applying threshold.

	const Vec4		i0				= c0*(1.0f - fBounds[0]) + c1*fBounds[0];
	const Vec4		i1				= c0*(1.0f - fBounds[1]) + c1*fBounds[1];
	const Vec4		rMin			= result - prec.colorThreshold;
	const Vec4		rMax			= result + prec.colorThreshold;
	bool			allIntersect	= true;

	// Algorithm: For each component check whether segment endpoints are inside, or intersect with slab.
	// If all intersect or are inside, line segment intersects the whole 4D AABB.
	for (int compNdx = 0; compNdx < 4; compNdx++)
	{
		if (!prec.colorMask[compNdx])
			continue;

		// Signs for both bounds: false = left, true = right.
		const bool	sMin0	= i0[compNdx] >= rMin[compNdx];
		const bool	sMin1	= i1[compNdx] >= rMin[compNdx];
		const bool	sMax0	= i0[compNdx] > rMax[compNdx];
		const bool	sMax1	= i1[compNdx] > rMax[compNdx];

		// If all signs are equal, line segment is outside bounds.
		if (sMin0 == sMin1 && sMin1 == sMax0 && sMax0 == sMax1)
		{
			allIntersect = false;
			break;
		}
	}

	return allIntersect;
}